

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCRgbaFile.cpp
# Opt level: O3

void ImfFloatToHalfArray(int n,float *f,ImfHalf *h)

{
  float fVar1;
  char cVar2;
  ulong uVar3;
  ImfHalf IVar4;
  float fVar5;
  uint uVar6;
  
  if (0 < n) {
    uVar3 = 0;
    do {
      fVar1 = f[uVar3];
      fVar5 = ABS(fVar1);
      IVar4 = (ushort)((uint)fVar1 >> 0x10) & 0x8000;
      if ((uint)fVar5 < 0x38800000) {
        if ((0x33000000 < (uint)fVar5) &&
           (uVar6 = (uint)fVar1 & 0x7fffff | 0x800000, cVar2 = (char)((uint)fVar5 >> 0x17),
           IVar4 = IVar4 | (ushort)(uVar6 >> (0x7eU - cVar2 & 0x1f)),
           0x80000000 < uVar6 << (cVar2 + 0xa2U & 0x1f))) {
          IVar4 = IVar4 + 1;
        }
      }
      else if ((uint)fVar5 < 0x7f800000) {
        if ((uint)fVar5 < 0x477ff000) {
          IVar4 = (ushort)((int)fVar5 + 0x8000fff + (uint)(((uint)fVar5 >> 0xd & 1) != 0) >> 0xd) |
                  IVar4;
        }
        else {
          IVar4 = IVar4 | 0x7c00;
        }
      }
      else {
        IVar4 = IVar4 | 0x7c00;
        if (fVar5 != INFINITY) {
          uVar6 = (uint)fVar5 >> 0xd & 0x3ff;
          IVar4 = IVar4 | (ushort)uVar6 | (ushort)(uVar6 == 0);
        }
      }
      h[uVar3] = IVar4;
      uVar3 = uVar3 + 1;
    } while ((uint)n != uVar3);
  }
  return;
}

Assistant:

void
ImfFloatToHalfArray (int n, const float f[/*n*/], ImfHalf h[/*n*/])
{
    for (int i = 0; i < n; ++i)
        h[i] = half (f[i]).bits ();
}